

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

HelicsFederateState helicsFederateGetState(HelicsFederate fed,HelicsError *err)

{
  element_type *peVar1;
  HelicsFederateState HVar2;
  FedObject *pFVar3;
  
  pFVar3 = helics::getFedObject(fed,err);
  HVar2 = HELICS_STATE_UNKNOWN;
  if ((pFVar3 != (FedObject *)0x0) &&
     (peVar1 = (pFVar3->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar1 != (element_type *)0x0)) {
    HVar2 = (HelicsFederateState)(char)(peVar1->currentMode)._M_i;
  }
  return HVar2;
}

Assistant:

HelicsFederateState helicsFederateGetState(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_STATE_UNKNOWN;
    }

    auto fedMode = fedObj->getCurrentMode();
    return stateConversion(fedMode);
}